

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

int __thiscall QFileSystemModel::rmdir(QFileSystemModel *this,char *__path)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QDir local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  filePath((QString *)&local_48,this,(QModelIndex *)__path);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QDir::QDir(local_50,(QString *)&local_68);
  iVar1 = QDir::rmdir((QString *)local_50);
  QDir::~QDir(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if ((char)iVar1 != '\0') {
    QFileInfoGatherer::removePath
              (*(QFileInfoGatherer **)(*(long *)&this->field_0x8 + 0xe0),(QString *)&local_48);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::rmdir(const QModelIndex &aindex)
{
    QString path = filePath(aindex);
    const bool success = QDir().rmdir(path);
#if QT_CONFIG(filesystemwatcher)
    if (success) {
        QFileSystemModelPrivate * d = const_cast<QFileSystemModelPrivate*>(d_func());
        d->fileInfoGatherer->removePath(path);
    }
#endif
    return success;
}